

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

char * vkb::to_string(SwapchainError err)

{
  if (err < (required_usage_not_supported|failed_query_surface_support_details)) {
    return &DAT_001113a4 + *(int *)(&DAT_001113a4 + (ulong)err * 4);
  }
  return "";
}

Assistant:

const char* to_string(SwapchainError err) {
    switch (err) {
        CASE_TO_STRING(SwapchainError, surface_handle_not_provided)
        CASE_TO_STRING(SwapchainError, failed_query_surface_support_details)
        CASE_TO_STRING(SwapchainError, failed_create_swapchain)
        CASE_TO_STRING(SwapchainError, failed_get_swapchain_images)
        CASE_TO_STRING(SwapchainError, failed_create_swapchain_image_views)
        CASE_TO_STRING(SwapchainError, required_min_image_count_too_low)
        CASE_TO_STRING(SwapchainError, required_usage_not_supported)
        default:
            return "";
    }
}